

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhaseObserver.cpp
# Opt level: O3

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  Phase PVar1;
  Player *pPVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It is ",6);
  pPVar2 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  psVar3 = Player::getPlayerName_abi_cxx11_(pPVar2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'s turn",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pPVar2 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  PVar1 = Player::getPhase(pPVar2);
  if (PVar1 == Roll) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pcVar6 = "-----------------------------------";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-----------------------------------",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| PHASE: ",9);
    pPVar2 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    psVar3 = Player::getPlayerName_abi_cxx11_(pPVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is rolling. |",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar5 = 0x23;
  }
  else if (PVar1 == Buy) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pcVar6 = 
    "--------------------------------------------------------------------------------------------";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "--------------------------------------------------------------------------------------------"
               ,0x5c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| PHASE: ",9);
    pPVar2 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    psVar3 = Player::getPlayerName_abi_cxx11_(pPVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is buying cards. |",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar5 = 0x5c;
  }
  else {
    if (PVar1 != Move) {
      return;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pcVar6 = 
    "---------------------------------------------------------------------------------------";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------------------"
               ,0x57);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| PHASE: ",9);
    pPVar2 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    psVar3 = Player::getPlayerName_abi_cxx11_(pPVar2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is rolling. |",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar5 = 0x57;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void PhaseObserver::update() {
    cout << "It is " << dynamic_cast<Player *>(concreteSubject)->getPlayerName() << "'s turn" << endl;

    Player::Phase currentPhase = (dynamic_cast<Player *>(concreteSubject)->getPhase());

    if (currentPhase == Player::Phase::Move) {
        cout << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Buy) {
        cout << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is buying cards. |" << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Roll){
        cout << endl;
        cout << "-----------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "-----------------------------------" << endl;
        cout << endl;


    }

}